

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

void __thiscall
QUrlModel::setUrl(QUrlModel *this,QModelIndex *index,QUrl *url,QModelIndex *dirIndex)

{
  QList<QUrl> *vector;
  QAbstractItemModel *pQVar1;
  QSize QVar2;
  undefined1 *puVar3;
  QSize QVar4;
  storage_type_conflict *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar9;
  int iVar11;
  bool bVar8;
  byte bVar10;
  QIconPrivate *__old_val;
  long *plVar12;
  qsizetype qVar13;
  QMetaType QVar14;
  long lVar15;
  long lVar16;
  QSize *pQVar17;
  QIconPrivate *pQVar18;
  Mode MVar19;
  anon_union_24_3_e3d07ef4_for_data *paVar20;
  long in_FS_OFFSET;
  double dVar21;
  QStringView QVar22;
  QStringView QVar23;
  QIcon oldIcon;
  QIcon newIcon;
  QIcon moved;
  QIcon local_c0;
  QSize local_b8;
  QMetaType local_b0 [3];
  QSize local_98;
  storage_type_conflict *psStack_90;
  undefined1 *local_88;
  QSize local_78;
  storage_type_conflict *psStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant((QVariant *)&local_58,url);
  (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x101);
  ::QVariant::~QVariant((QVariant *)&local_58);
  paVar20 = &local_58;
  QUrl::path(paVar20,url,0x7f00000);
  uVar6 = local_58._16_8_;
  if ((InterfaceType *)local_58.shared != (InterfaceType *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if ((undefined1 *)uVar6 == (undefined1 *)0x0) {
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    local_78.wd.m_i = 0;
    local_78.ht.m_i = 0;
    psStack_70 = (storage_type_conflict *)0x0;
    local_68 = (undefined1 *)0x0;
    if (this->showFullPath == true) {
      pQVar1 = (dirIndex->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = (undefined1 *)0x0;
        local_40 = 2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,0x101);
      }
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)&local_98);
      psVar5 = psStack_70;
      QVar4 = local_78;
      puVar3 = local_88;
      QVar2 = local_98;
      local_98 = local_78;
      local_78 = QVar2;
      psStack_70 = psStack_90;
      psStack_90 = psVar5;
      local_88 = local_68;
      local_68 = puVar3;
      if (QVar4 != (QSize)0x0) {
        LOCK();
        *(int *)QVar4 = *(int *)QVar4 + -1;
        UNLOCK();
        if (*(int *)QVar4 == 0) {
          QArrayData::deallocate((QArrayData *)QVar4,2,0x10);
        }
      }
      if (local_b0[0].d_ptr != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_b0[0].d_ptr = *(int *)local_b0[0].d_ptr + -1;
        iVar11._0_2_ = (local_b0[0].d_ptr)->revision;
        iVar11._2_2_ = (local_b0[0].d_ptr)->alignment;
        UNLOCK();
        if (iVar11 == 0) {
          QArrayData::deallocate((QArrayData *)local_b0[0].d_ptr,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    else {
      pQVar1 = (dirIndex->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = (undefined1 *)0x0;
        local_40 = 2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,0);
      }
      ::QVariant::toString();
      psVar5 = psStack_70;
      QVar4 = local_78;
      puVar3 = local_88;
      QVar2 = local_98;
      local_98 = local_78;
      local_78 = QVar2;
      psStack_70 = psStack_90;
      psStack_90 = psVar5;
      local_88 = local_68;
      local_68 = puVar3;
      if (QVar4 != (QSize)0x0) {
        LOCK();
        *(int *)QVar4 = *(int *)QVar4 + -1;
        UNLOCK();
        if (*(int *)QVar4 == 0) {
          QArrayData::deallocate((QArrayData *)QVar4,2,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    local_b8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (dirIndex->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,1);
    }
    local_98 = (QSize)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_b0[0].d_ptr = (QMetaTypeInterface *)(local_40 & 0xfffffffffffffffc);
    bVar8 = comparesEqual(local_b0,(QMetaType *)&local_98);
    uVar6 = local_58.shared;
    if (bVar8) {
      if ((local_40 & 1) == 0) {
        local_58.shared = (PrivateShared *)0x0;
        local_b8 = (QSize)uVar6;
      }
      else {
        pQVar17 = (QSize *)(local_58.shared + *(int *)(local_58.shared + 4));
        if (*(int *)local_58.shared == 1) {
          local_b8 = *pQVar17;
          pQVar17->wd = 0;
          pQVar17->ht = 0;
        }
        else {
          QIcon::QIcon((QIcon *)&local_b8,(QIcon *)pQVar17);
        }
      }
    }
    else {
      local_b8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon((QIcon *)&local_b8);
      QVar14.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar20 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar14,paVar20,(QMetaType)local_98,&local_b8);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (((dirIndex->r < 0) || (dirIndex->c < 0)) || ((dirIndex->m).ptr == (QAbstractItemModel *)0x0)
       ) {
      plVar12 = (long *)QFileSystemModel::iconProvider();
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 0x10))(&local_98,plVar12,5);
        QVar2 = local_98;
        local_58.shared = (PrivateShared *)local_b8;
        local_98.wd.m_i = 0;
        local_98.ht.m_i = 0;
        local_b8 = QVar2;
        QIcon::~QIcon((QIcon *)&local_58.shared);
        QIcon::~QIcon((QIcon *)&local_98);
      }
      QUrl::toLocalFile();
      QFileInfo::QFileInfo((QFileInfo *)local_b0,(QString *)&local_98);
      QFileInfo::fileName();
      uVar7 = local_58._16_8_;
      uVar6 = local_58.shared;
      psVar5 = psStack_70;
      QVar2 = local_78;
      local_58.shared = (PrivateShared *)local_78;
      local_78 = (QSize)uVar6;
      psStack_70 = (storage_type_conflict *)local_58._8_8_;
      local_58._8_8_ = psVar5;
      local_58._16_8_ = local_68;
      local_68 = (undefined1 *)uVar7;
      if (QVar2 != (QSize)0x0) {
        LOCK();
        *(int *)QVar2 = *(int *)QVar2 + -1;
        UNLOCK();
        if (*(int *)QVar2 == 0) {
          QArrayData::deallocate((QArrayData *)QVar2,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)local_b0);
      if (local_98 != (QSize)0x0) {
        LOCK();
        *(int *)local_98 = *(int *)local_98 + -1;
        UNLOCK();
        if (*(int *)local_98 == 0) {
          QArrayData::deallocate((QArrayData *)local_98,2,0x10);
        }
      }
      vector = &this->invalidUrls;
      qVar13 = QtPrivate::indexOf<QUrl,QUrl>(vector,url,0);
      if (qVar13 == -1) {
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)vector,(this->invalidUrls).d.size,url);
        QList<QUrl>::end(vector);
      }
      bVar8 = false;
    }
    else {
      bVar8 = true;
    }
    ::QVariant::QVariant((QVariant *)&local_58,bVar8);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x102);
    ::QVariant::~QVariant((QVariant *)&local_58);
    cVar9 = QIcon::isNull();
    if (cVar9 == '\0') {
      local_58.shared = (PrivateShared *)0x2000000020;
      iVar11 = QIcon::actualSize(&local_b8,(Mode)&local_58,On);
      if (iVar11 < 0x20) {
        lVar15 = *(long *)(*(long *)&this->field_0x8 + 0x10);
        if (lVar15 == 0) {
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          if ((*(byte *)(*(long *)(lVar15 + 8) + 0x30) & 1) != 0) {
            lVar16 = lVar15;
          }
        }
        if (lVar16 == 0) {
          dVar21 = (double)QGuiApplication::devicePixelRatio();
        }
        else {
          dVar21 = (double)QPaintDevice::devicePixelRatio();
        }
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.wd.m_i = 0x20;
        local_98.ht.m_i = 0x20;
        QIcon::pixmap((QSize *)&local_58.shared,dVar21,(Mode)&local_b8,(State)&local_98);
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        psStack_90 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        MVar19 = (Mode)&local_98;
        QPixmap::scaledToWidth(MVar19,(TransformationMode)&local_58);
        QIcon::addPixmap((QPixmap *)&local_b8,MVar19,On);
        QPixmap::~QPixmap((QPixmap *)&local_98);
        QPixmap::~QPixmap((QPixmap *)local_58.data);
      }
    }
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,0);
    }
    ::QVariant::toString();
    bVar10 = 1;
    if (local_88 == local_68) {
      QVar22.m_data = psStack_90;
      QVar22.m_size = (qsizetype)local_88;
      QVar23.m_data = psStack_70;
      QVar23.m_size = (qsizetype)local_68;
      bVar10 = QtPrivate::equalStrings(QVar22,QVar23);
      bVar10 = bVar10 ^ 1;
    }
    if (local_98 != (QSize)0x0) {
      LOCK();
      *(int *)local_98 = *(int *)local_98 + -1;
      UNLOCK();
      if (*(int *)local_98 == 0) {
        QArrayData::deallocate((QArrayData *)local_98,2,0x10);
      }
    }
    paVar20 = &local_58;
    ::QVariant::~QVariant((QVariant *)paVar20);
    if (bVar10 != 0) {
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_78);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    local_c0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,1);
    }
    local_98 = (QSize)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_b0[0].d_ptr = (QMetaTypeInterface *)(local_40 & 0xfffffffffffffffc);
    bVar8 = comparesEqual(local_b0,(QMetaType *)&local_98);
    uVar6 = local_58.shared;
    if (bVar8) {
      if ((local_40 & 1) == 0) {
        local_58.shared = (PrivateShared *)0x0;
        local_c0.d = (QIconPrivate *)uVar6;
      }
      else {
        pQVar18 = (QIconPrivate *)(local_58.shared + *(int *)(local_58.shared + 4));
        if (*(int *)local_58.shared == 1) {
          local_c0.d = *(QIconPrivate **)pQVar18;
          *(undefined8 *)pQVar18 = 0;
        }
        else {
          QIcon::QIcon(&local_c0,(QIcon *)pQVar18);
        }
      }
    }
    else {
      local_c0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon(&local_c0);
      QVar14.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar20 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar14,paVar20,(QMetaType)local_98,&local_c0);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    lVar15 = QIcon::cacheKey();
    lVar16 = QIcon::cacheKey();
    if (lVar15 != lVar16) {
      QIcon::operator_cast_to_QVariant((QVariant *)&local_58,(QIcon *)&local_b8);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QIcon::~QIcon(&local_c0);
    QIcon::~QIcon((QIcon *)&local_b8);
    if (local_78 != (QSize)0x0) {
      LOCK();
      *(int *)local_78 = *(int *)local_78 + -1;
      UNLOCK();
      if (*(int *)local_78 == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::setUrl(const QModelIndex &index, const QUrl &url, const QModelIndex &dirIndex)
{
    setData(index, url, UrlRole);
    if (url.path().isEmpty()) {
        setData(index, fileSystemModel->myComputer());
        setData(index, fileSystemModel->myComputer(Qt::DecorationRole), Qt::DecorationRole);
    } else {
        QString newName;
        if (showFullPath) {
            //On windows the popup display the "C:\", convert to nativeSeparators
            newName = QDir::toNativeSeparators(dirIndex.data(QFileSystemModel::FilePathRole).toString());
        } else {
            newName = dirIndex.data().toString();
        }

        QIcon newIcon = qvariant_cast<QIcon>(dirIndex.data(Qt::DecorationRole));
        if (!dirIndex.isValid()) {
            const QAbstractFileIconProvider *provider = fileSystemModel->iconProvider();
            if (provider)
                newIcon = provider->icon(QAbstractFileIconProvider::Folder);
            newName = QFileInfo(url.toLocalFile()).fileName();
            if (!invalidUrls.contains(url))
                invalidUrls.append(url);
            //The bookmark is invalid then we set to false the EnabledRole
            setData(index, false, EnabledRole);
        } else {
            //The bookmark is valid then we set to true the EnabledRole
            setData(index, true, EnabledRole);
        }

        // newIcon could be null if fileSystemModel->iconProvider() returns null
        if (!newIcon.isNull()) {
        // Make sure that we have at least 32x32 images
            const QSize size = newIcon.actualSize(QSize(32,32));
            if (size.width() < 32) {
                const auto widget = qobject_cast<QWidget *>(parent());
                const auto dpr = widget ? widget->devicePixelRatio() : qApp->devicePixelRatio();
                const auto smallPixmap = newIcon.pixmap(QSize(32, 32), dpr);
                const auto newPixmap = smallPixmap.scaledToWidth(32 * dpr, Qt::SmoothTransformation);
                newIcon.addPixmap(newPixmap);
            }
        }

        if (index.data().toString() != newName)
            setData(index, newName);
        QIcon oldIcon = qvariant_cast<QIcon>(index.data(Qt::DecorationRole));
        if (oldIcon.cacheKey() != newIcon.cacheKey())
            setData(index, newIcon, Qt::DecorationRole);
    }
}